

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O1

void duckdb::StringDecompressFunction<unsigned_char>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  data_t dVar2;
  idx_t count;
  ulong *puVar3;
  unsigned_long *puVar4;
  string_t *psVar5;
  allocate_function_ptr_t p_Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uchar *ldata;
  byte bVar7;
  bool bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  SelectionVector *pSVar11;
  uint uVar12;
  reference vector;
  VectorBuffer *pVVar13;
  ulong uVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  idx_t iVar16;
  idx_t idx_in_entry;
  ulong uVar17;
  idx_t iVar18;
  void *in_R9;
  data_ptr_t pdVar19;
  optional_idx dict_size;
  undefined1 in_stack_ffffffffffffff48;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  Vector *local_98;
  idx_t local_90;
  data_ptr_t local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_78.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_78);
  ArenaAllocator::Reset((ArenaAllocator *)&(local_78.sel)->selection_data);
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar1 = vector->vector_type;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar5 = (string_t *)result->data;
    ldata = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_char,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_char>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_char_const&)_1_>
              (ldata,psVar5,count,&vector->validity,&result->validity,in_R9,
               (bool)in_stack_ffffffffffffff48);
    return;
  }
  if (VVar1 != DICTIONARY_VECTOR) {
    if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar3 = (ulong *)result->data;
      pdVar19 = vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      dVar2 = *pdVar19;
      uVar12 = (uint)(byte)(dVar2 - 1);
      if (dVar2 == '\0') {
        uVar12 = 0;
      }
      *puVar3 = (ulong)(dVar2 != '\0') | (ulong)uVar12 << 0x20;
      puVar3[1] = 0;
      return;
    }
    goto LAB_009162dd;
  }
  DictionaryVector::VerifyDictionary(vector);
  pVVar13 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
  local_78.sel = (SelectionVector *)pVVar13[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar16 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar16 * 2)) {
LAB_009162d3:
    bVar8 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(vector);
    pVVar13 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
    if (*(char *)&pVVar13[1]._vptr_VectorBuffer != '\0') goto LAB_009162d3;
    local_98 = (Vector *)(pVVar13 + 1);
    psVar5 = (string_t *)result->data;
    local_88 = pVVar13[1].data.pointer;
    local_90 = optional_idx::GetIndex((optional_idx *)&local_78);
    FlatVector::VerifyFlatVector(local_98);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_char,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_char>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_char_const&)_1_>
              (local_88,psVar5,local_90,(ValidityMask *)&pVVar13[1].data.allocated_size,
               &result->validity,in_R9,(bool)in_stack_ffffffffffffff48);
    DictionaryVector::VerifyDictionary(vector);
    pVVar13 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
    iVar16 = optional_idx::GetIndex((optional_idx *)&local_78);
    Vector::Dictionary(result,result,iVar16,(SelectionVector *)(pVVar13 + 1),count);
    bVar8 = true;
  }
  if (bVar8) {
    return;
  }
LAB_009162dd:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(vector,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar11 = local_78.sel;
  pdVar19 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      p_Var6 = (allocate_function_ptr_t)pSVar11->sel_vector;
      pdVar19 = pdVar19 + 8;
      iVar16 = 0;
      do {
        iVar18 = iVar16;
        if (p_Var6 != (allocate_function_ptr_t)0x0) {
          iVar18 = (idx_t)*(uint *)(p_Var6 + iVar16 * 4);
        }
        dVar2 = local_78.data[iVar18];
        uVar12 = (uint)(byte)(dVar2 - 1);
        if (dVar2 == '\0') {
          uVar12 = 0;
        }
        *(ulong *)(pdVar19 + -8) = (ulong)(dVar2 != '\0') | (ulong)uVar12 << 0x20;
        pdVar19[0] = '\0';
        pdVar19[1] = '\0';
        pdVar19[2] = '\0';
        pdVar19[3] = '\0';
        pdVar19[4] = '\0';
        pdVar19[5] = '\0';
        pdVar19[6] = '\0';
        pdVar19[7] = '\0';
        iVar16 = iVar16 + 1;
        pdVar19 = pdVar19 + 0x10;
      } while (count != iVar16);
    }
  }
  else if (count != 0) {
    p_Var6 = (allocate_function_ptr_t)pSVar11->sel_vector;
    pdVar19 = pdVar19 + 8;
    uVar17 = 0;
    do {
      uVar14 = uVar17;
      if (p_Var6 != (allocate_function_ptr_t)0x0) {
        uVar14 = (ulong)*(uint *)(p_Var6 + uVar17 * 4);
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar14 >> 6]
           >> (uVar14 & 0x3f) & 1) == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_a8,&local_80);
          p_Var10 = p_Stack_a0;
          peVar9 = local_a8;
          local_a8 = (element_type *)0x0;
          p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar9;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var10;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
          }
          pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar15->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar7 = (byte)uVar17 & 0x3f;
        puVar3 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar17 >> 6);
        *puVar3 = *puVar3 & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7);
      }
      else {
        dVar2 = local_78.data[uVar14];
        uVar12 = (uint)(byte)(dVar2 - 1);
        if (dVar2 == '\0') {
          uVar12 = 0;
        }
        *(ulong *)(pdVar19 + -8) = (ulong)(dVar2 != '\0') | (ulong)uVar12 << 0x20;
        pdVar19[0] = '\0';
        pdVar19[1] = '\0';
        pdVar19[2] = '\0';
        pdVar19[3] = '\0';
        pdVar19[4] = '\0';
        pdVar19[5] = '\0';
        pdVar19[6] = '\0';
        pdVar19[7] = '\0';
      }
      uVar17 = uVar17 + 1;
      pdVar19 = pdVar19 + 0x10;
    } while (count != uVar17);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void StringDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &allocator = ExecuteFunctionState::GetFunctionState(state)->Cast<StringDecompressLocalState>().allocator;
	allocator.Reset();
	UnaryExecutor::Execute<INPUT_TYPE, string_t>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) { return StringDecompress<INPUT_TYPE>(input, allocator); },
	    FunctionErrors::CANNOT_ERROR);
}